

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O1

point_type __thiscall
plot::RealCanvas<plot::BrailleCanvas>::map(RealCanvas<plot::BrailleCanvas> *this,Pointf *p)

{
  float fVar1;
  size_t sVar2;
  long lVar3;
  point_type pVar4;
  
  sVar2 = (this->canvas_).lines_;
  fVar1 = (this->bounds_).p1.x;
  pVar4.x = lroundf((float)(long)((this->canvas_).cols_ * 2 + -1) *
                    ((p->x - fVar1) / ((this->bounds_).p2.x - fVar1)));
  fVar1 = (this->bounds_).p1.y;
  lVar3 = lroundf((float)(long)(sVar2 * 4 + -1) * ((p->y - fVar1) / ((this->bounds_).p2.y - fVar1)))
  ;
  pVar4.y = lVar3;
  return pVar4;
}

Assistant:

typename Canvas::point_type map(Pointf const& p) const {
        auto canvas_bounds = canvas_.size();
        canvas_bounds -= decltype(canvas_bounds){ 1, 1 };
        return {
            std::lround((p.x - bounds_.p1.x)/(bounds_.p2.x - bounds_.p1.x) * canvas_bounds.x),
            std::lround((p.y - bounds_.p1.y)/(bounds_.p2.y - bounds_.p1.y) * canvas_bounds.y)
        };
    }